

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O0

void __thiscall ev3dev::sound_sensor::sound_sensor(sound_sensor *this,address_type *address)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  string *in_RSI;
  lego_port port;
  char *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  bool local_202;
  allocator_type *in_stack_fffffffffffffe00;
  sensor *this_00;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe08;
  sensor *this_01;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe10;
  iterator this_02;
  string *this_03;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [72];
  string local_140 [79];
  byte local_f1;
  string local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [2];
  undefined1 local_ce;
  allocator local_cd [20];
  allocator local_b9;
  string *local_b8;
  string local_b0 [24];
  address_type *in_stack_ffffffffffffff68;
  lego_port *in_stack_ffffffffffffff70;
  string *local_70;
  undefined8 local_68;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc0;
  address_type *in_stack_ffffffffffffffc8;
  sensor *in_stack_ffffffffffffffd0;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0,in_RSI);
  local_ce = 1;
  local_b8 = local_b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"lego-nxt-sound",&local_b9);
  this_03 = (string *)&stack0xffffffffffffff70;
  local_b8 = this_03;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this_03,"nxt-analog",local_cd);
  local_ce = 0;
  local_70 = local_b0;
  local_68 = 2;
  this_02 = local_d0;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x125391);
  __l._M_len = (size_type)this_03;
  __l._M_array = this_02;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(in_stack_fffffffffffffe10,__l,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  sensor::sensor(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1253e9);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x1253f6);
  this_01 = (sensor *)local_b0;
  this_00 = (sensor *)&local_70;
  do {
    this_00 = (sensor *)&this_00[-1].super_device._device_index;
    std::__cxx11::string::~string((string *)this_00);
  } while (this_00 != this_01);
  std::allocator<char>::~allocator((allocator<char> *)local_cd);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  local_f1 = 0;
  bVar1 = device::connected((device *)0x12546f);
  local_202 = false;
  if (bVar1) {
    sensor::driver_name_abi_cxx11_(this_01);
    local_f1 = 1;
    local_202 = std::operator==(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  }
  if ((local_f1 & 1) != 0) {
    std::__cxx11::string::~string(local_f0);
  }
  if (local_202 != false) {
    std::__cxx11::string::string(local_140,in_RSI);
    lego_port::lego_port(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::__cxx11::string::~string(local_140);
    bVar1 = device::connected((device *)0x12553c);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_188,"lego-nxt-sound",&local_189);
      lego_port::set_set_device((lego_port *)this_02,(string *)this_00);
      lego_port::~lego_port((lego_port *)0x1255a8);
      std::__cxx11::string::~string(local_188);
      std::allocator<char>::~allocator((allocator<char> *)&local_189);
      lego_port::status_abi_cxx11_((lego_port *)this_01);
      bVar1 = std::operator!=(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      std::__cxx11::string::~string(local_1b0);
      if (bVar1) {
        std::__cxx11::string::clear();
      }
    }
    else {
      std::__cxx11::string::clear();
    }
    lego_port::~lego_port((lego_port *)0x125861);
  }
  return;
}

Assistant:

sound_sensor::sound_sensor(address_type address)
    : sensor(address, { nxt_sound, nxt_analog })
{
    if (connected() && driver_name() == nxt_analog) {
        lego_port port(address);

        if (port.connected()) {
            port.set_set_device(nxt_sound);

            if (port.status() != nxt_sound) {
                // Failed to load lego-nxt-sound friver. Wrong port?
                _path.clear();
            }
        } else {
            _path.clear();
        }
    }
}